

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramAnalyzeEntropyBin(VP8LHistogramSet *image_histo,int low_effort)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int *in_RDI;
  DominantCostRange cost_range;
  int histo_size;
  VP8LHistogram **histograms;
  int i;
  int in_stack_ffffffffffffffb4;
  DominantCostRange *in_stack_ffffffffffffffb8;
  VP8LHistogram *in_stack_ffffffffffffffc0;
  int local_10;
  
  lVar2 = *(long *)(in_RDI + 2);
  iVar1 = *in_RDI;
  DominantCostRangeInit((DominantCostRange *)&stack0xffffffffffffffb0);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    UpdateDominantCostRange
              (*(VP8LHistogram **)(lVar2 + (long)local_10 * 8),
               (DominantCostRange *)&stack0xffffffffffffffb0);
  }
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    iVar3 = GetHistoBinIndex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb4);
    *(short *)(*(long *)(lVar2 + (long)local_10 * 8) + 0xcee) = (short)iVar3;
  }
  return;
}

Assistant:

static void HistogramAnalyzeEntropyBin(VP8LHistogramSet* const image_histo,
                                       int low_effort) {
  int i;
  VP8LHistogram** const histograms = image_histo->histograms;
  const int histo_size = image_histo->size;
  DominantCostRange cost_range;
  DominantCostRangeInit(&cost_range);

  // Analyze the dominant (literal, red and blue) entropy costs.
  for (i = 0; i < histo_size; ++i) {
    UpdateDominantCostRange(histograms[i], &cost_range);
  }

  // bin-hash histograms on three of the dominant (literal, red and blue)
  // symbol costs and store the resulting bin_id for each histogram.
  for (i = 0; i < histo_size; ++i) {
    histograms[i]->bin_id =
        GetHistoBinIndex(histograms[i], &cost_range, low_effort);
  }
}